

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
getTypeHierarchy(UA_NodeStore *ns,UA_Node *rootRef,UA_Boolean inverse,UA_NodeId **typeHierarchy,
                size_t *typeHierarchySize)

{
  UA_ReferenceNode *pUVar1;
  undefined8 ns_00;
  UA_Boolean UVar2;
  UA_StatusCode UVar3;
  UA_NodeId *pUVar4;
  UA_NodeStoreEntry **ppUVar5;
  int iVar6;
  UA_Node *pUVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 local_a0 [8];
  UA_NodeId hasSubtypeNodeId;
  ulong local_68;
  ulong local_60;
  ulong local_48;
  UA_NodeId *local_40;
  UA_StatusCode local_34;
  
  hasSubtypeNodeId.identifier.string.data = (UA_Byte *)ns;
  local_40 = (UA_NodeId *)malloc(0x1e0);
  if (local_40 == (UA_NodeId *)0x0) {
    UVar3 = 0x80030000;
  }
  else {
    UVar3 = UA_copy(rootRef,local_40,UA_TYPES + 0x10);
    if (UVar3 == 0) {
      local_a0._0_2_ = 0;
      stack0xffffffffffffff64 = 0x2d00000000;
      local_68 = 0x14;
      local_60 = 0;
      local_48 = 0;
      pUVar7 = rootRef;
      do {
        if (pUVar7->referencesSize == 0) {
          local_34 = 0;
        }
        else {
          uVar9 = 0;
          local_34 = 0;
          do {
            pUVar1 = pUVar7->references;
            if ((pUVar1[uVar9].isInverse == inverse) &&
               (UVar2 = UA_NodeId_equal((UA_NodeId *)local_a0,&pUVar1[uVar9].referenceTypeId), UVar2
               )) {
              uVar8 = 0;
              pUVar4 = local_40;
              do {
                UVar2 = UA_NodeId_equal(&pUVar1[uVar9].targetId.nodeId,pUVar4);
                if (UVar2) {
                  iVar6 = 6;
                  goto LAB_0011b9db;
                }
                uVar8 = uVar8 + 1;
                pUVar4 = pUVar4 + 1;
              } while (uVar8 <= local_48);
              uVar8 = local_48 + 1;
              if (uVar8 < local_68) {
LAB_0011b99f:
                local_34 = UA_copy(&pUVar7->references[uVar9].targetId,local_40 + uVar8,
                                   UA_TYPES + 0x10);
                iVar6 = (uint)(local_34 != 0) << 2;
                local_48 = uVar8;
              }
              else {
                pUVar4 = (UA_NodeId *)realloc(local_40,local_68 * 0x30);
                if (pUVar4 != (UA_NodeId *)0x0) {
                  local_68 = local_68 * 2;
                  local_40 = pUVar4;
                  goto LAB_0011b99f;
                }
                local_34 = 0x80030000;
                iVar6 = 4;
              }
LAB_0011b9db:
              if ((iVar6 != 6) && (iVar6 != 0)) break;
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < pUVar7->referencesSize);
        }
        ns_00 = hasSubtypeNodeId.identifier.string.data;
        uVar9 = local_60 + 1;
        if ((local_48 < uVar9) || (local_34 != 0)) {
LAB_0011ba87:
          if (local_34 != 0) {
            UA_Array_delete(local_40,local_48,UA_TYPES + 0x10);
            return local_34;
          }
          *typeHierarchy = local_40;
          *typeHierarchySize = local_48 + 1;
          return 0;
        }
        pUVar4 = local_40 + local_60;
        while( true ) {
          pUVar4 = pUVar4 + 1;
          ppUVar5 = findNode((UA_NodeStore *)ns_00,pUVar4);
          if (ppUVar5 == (UA_NodeStoreEntry **)0x0) {
            pUVar7 = (UA_Node *)0x0;
          }
          else {
            pUVar7 = &(*ppUVar5)->node;
          }
          if ((pUVar7 != (UA_Node *)0x0) &&
             (local_60 = uVar9, pUVar7->nodeClass == rootRef->nodeClass)) break;
          uVar9 = uVar9 + 1;
          if (local_48 < uVar9) goto LAB_0011ba87;
        }
      } while( true );
    }
    free(local_40);
  }
  return UVar3;
}

Assistant:

UA_StatusCode
getTypeHierarchy(UA_NodeStore *ns, const UA_Node *rootRef, UA_Boolean inverse,
                 UA_NodeId **typeHierarchy, size_t *typeHierarchySize) {
    size_t results_size = 20; // probably too big, but saves mallocs
    UA_NodeId *results = UA_malloc(sizeof(UA_NodeId) * results_size);
    if(!results)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    UA_StatusCode retval = UA_NodeId_copy(&rootRef->nodeId, &results[0]);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_free(results);
        return retval;
    }

    const UA_Node *node = rootRef;
    size_t idx = 0; /* Current index (contains NodeId of node) */
    size_t last = 0; /* Index of the last element in the array */
    const UA_NodeId hasSubtypeNodeId = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
    while(true) {
        for(size_t i = 0; i < node->referencesSize; ++i) {
            /* is the reference relevant? */
            if(node->references[i].isInverse != inverse ||
               !UA_NodeId_equal(&hasSubtypeNodeId, &node->references[i].referenceTypeId))
                continue;

            /* is the target already considered? (multi-inheritance) */
            UA_Boolean duplicate = false;
            for(size_t j = 0; j <= last; ++j) {
                if(UA_NodeId_equal(&node->references[i].targetId.nodeId, &results[j])) {
                    duplicate = true;
                    break;
                }
            }
            if(duplicate)
                continue;

            /* increase array length if necessary */
            if(last + 1 >= results_size) {
                                UA_NodeId *new_results =
                                    UA_realloc(results, sizeof(UA_NodeId) * results_size * 2);
                                if(!new_results) {
                                    retval = UA_STATUSCODE_BADOUTOFMEMORY;
                                    break;
                                }
                                results = new_results;
                                results_size *= 2;
            }

            /* copy new nodeid to the end of the list */
            retval = UA_NodeId_copy(&node->references[i].targetId.nodeId, &results[++last]);
            if(retval != UA_STATUSCODE_GOOD)
                break;
        }

        /* Get the next node */
    next:
        ++idx;
        if(idx > last || retval != UA_STATUSCODE_GOOD)
            break;
        node = UA_NodeStore_get(ns, &results[idx]);
        if(!node || node->nodeClass != rootRef->nodeClass)
            goto next;
    }

    if(retval != UA_STATUSCODE_GOOD) {
        UA_Array_delete(results, last, &UA_TYPES[UA_TYPES_NODEID]);
        return retval;
    }

    *typeHierarchy = results;
    *typeHierarchySize = last + 1;
    return UA_STATUSCODE_GOOD;
}